

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

int __thiscall capnp::SchemaLoader::InitializerImpl::init(InitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  LazyLoadCallback *pLVar1;
  Mutex *this_00;
  int in_EAX;
  int extraout_EAX;
  RawSchema *pRVar2;
  TryGetResult TVar3;
  Fault f;
  Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> lock;
  
  pLVar1 = (this->callback).ptr;
  if (pLVar1 != (LazyLoadCallback *)0x0) {
    in_EAX = (**pLVar1->_vptr_LazyLoadCallback)(pLVar1,this->loader,*(undefined8 *)ctx);
  }
  if (*(long *)(ctx + 0x40) != 0) {
    this_00 = (Mutex *)this->loader;
    kj::_::Mutex::lock(this_00,SHARED);
    lock.ptr = (Own<capnp::SchemaLoader::Impl> *)(this_00 + 1);
    lock.mutex = this_00;
    TVar3 = Impl::tryGet((Impl *)this_00[1].waitersHead.ptr,*(uint64_t *)ctx);
    pRVar2 = TVar3.schema;
    if (pRVar2 != (RawSchema *)ctx) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x775,FAILED,"mutableSchema == schema",
                 "\"A schema not belonging to this loader used its initializer.\"",
                 (char (*) [60])"A schema not belonging to this loader used its initializer.");
      kj::_::Debug::Fault::fatal(&f);
    }
    pRVar2->lazyInitializer = (Initializer *)0x0;
    (pRVar2->defaultBrand).lazyInitializer = (Initializer *)0x0;
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked(&lock);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void SchemaLoader::InitializerImpl::init(const _::RawSchema* schema) const {
  KJ_IF_MAYBE(c, callback) {
    c->load(loader, schema->id);
  }

  if (schema->lazyInitializer != nullptr) {
    // The callback declined to load a schema.  We need to disable the initializer so that it
    // doesn't get invoked again later, as we can no longer modify this schema once it is in use.

    // Lock the loader for read to make sure no one is concurrently loading a replacement for this
    // schema node.
    auto lock = loader.impl.lockShared();

    // Get the mutable version of the schema.
    _::RawSchema* mutableSchema = lock->get()->tryGet(schema->id).schema;
    KJ_ASSERT(mutableSchema == schema,
              "A schema not belonging to this loader used its initializer.");

    // Disable the initializer.
#if __GNUC__
    __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
    __atomic_store_n(&mutableSchema->defaultBrand.lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
    std::atomic_thread_fence(std::memory_order_release);
    *static_cast<_::RawSchema::Initializer const* volatile*>(
        &mutableSchema->lazyInitializer) = nullptr;
    *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
        &mutableSchema->defaultBrand.lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
  }
}